

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_lookup.cc
# Opt level: O0

string * __thiscall
absl::time_internal::cctz::time_zone::version_abi_cxx11_
          (string *__return_storage_ptr__,time_zone *this)

{
  Impl *this_00;
  time_zone *this_local;
  
  this_00 = effective_impl(this);
  Impl::Version_abi_cxx11_(__return_storage_ptr__,this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string time_zone::version() const { return effective_impl().Version(); }